

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChLinkMarkers::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChLinkMarkers *this,uint nclone)

{
  ChFrame<double>::ChFrame
            (__return_storage_ptr__,(ChFrame<double> *)(*(long *)(this + 0xc0) + 0x248));
  return __return_storage_ptr__;
}

Assistant:

virtual ChFrame<> GetVisualModelFrame(unsigned int nclone = 0) override { return marker2->GetAbsFrame(); }